

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrays.h
# Opt level: O2

void __thiscall
glslang::TSmallArrayVector::push_back(TSmallArrayVector *this,uint e,TIntermTyped *n)

{
  TArraySize pair;
  value_type local_28;
  
  alloc(this);
  local_28.size = e;
  local_28.node = n;
  std::vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>::push_back
            (&this->sizes->
              super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>,
             &local_28);
  return;
}

Assistant:

void push_back(unsigned int e, TIntermTyped* n)
    {
        alloc();
        TArraySize pair = { e, n };
        sizes->push_back(pair);
    }